

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLSetImplement.h
# Opt level: O1

void __thiscall
STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_KDefectiveBase>::
removeVertexFromSet(STLSetImplement<std::set<int,_std::less<int>,_std::allocator<int>_>,_KDefectiveBase>
                    *this,void *ptr,int idx)

{
  long lVar1;
  long lVar2;
  long lVar3;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar4;
  int local_c;
  
  lVar1 = (long)ptr + 8;
  lVar2 = lVar1;
  for (lVar3 = *(long *)((long)ptr + 0x10); lVar3 != 0;
      lVar3 = *(long *)(lVar3 + 0x10 + (ulong)(*(int *)(lVar3 + 0x20) < idx) * 8)) {
    if (idx <= *(int *)(lVar3 + 0x20)) {
      lVar2 = lVar3;
    }
  }
  lVar3 = lVar1;
  if ((lVar2 != lVar1) && (lVar3 = lVar2, idx < *(int *)(lVar2 + 0x20))) {
    lVar3 = lVar1;
  }
  if (lVar3 != lVar1) {
    local_c = idx;
    pVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                         *)ptr,&local_c);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)ptr,
               (_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
  }
  return;
}

Assistant:

void STLSetImplement<Set, Base>::removeVertexFromSet(void *ptr, int idx) {
	Set *__ptr__ = (Set*) ptr;
	if (__ptr__ -> count(idx)) __ptr__ -> erase(idx);
}